

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

void duckdb::TernaryExecutor::
     ExecuteLoop<signed_char,signed_char,signed_char,signed_char,duckdb::TernaryLambdaWrapper,signed_char(*)(signed_char,signed_char,signed_char)>
               (char *adata,char *bdata,char *cdata,char *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,_func_char_char_char_char *fun)

{
  bool bVar1;
  char cVar2;
  _func_char_char_char_char *fun_00;
  idx_t iVar3;
  ValidityMask *mask;
  long in_RCX;
  ulong in_R8;
  SelectionVector *in_R9;
  idx_t cidx_1;
  idx_t bidx_1;
  idx_t aidx_1;
  idx_t i_1;
  idx_t cidx;
  idx_t bidx;
  idx_t aidx;
  idx_t i;
  idx_t in_stack_ffffffffffffff88;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff98;
  _func_char_char_char_char *in_stack_ffffffffffffffa0;
  ulong local_58;
  ulong local_38;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                    ((TemplatedValidityMask<unsigned_long> *)aidx_1);
  if (((bVar1) &&
      (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)i_1), bVar1)) &&
     (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                        ((TemplatedValidityMask<unsigned_long> *)cidx), bVar1)) {
    for (local_58 = 0; local_58 < in_R8; local_58 = local_58 + 1) {
      fun_00 = (_func_char_char_char_char *)SelectionVector::get_index(in_R9,local_58);
      iVar3 = SelectionVector::get_index((SelectionVector *)cidx_1,local_58);
      mask = (ValidityMask *)SelectionVector::get_index((SelectionVector *)bidx_1,local_58);
      cVar2 = TernaryLambdaWrapper::
              Operation<signed_char(*)(signed_char,signed_char,signed_char),signed_char,signed_char,signed_char,signed_char>
                        (fun_00,(char)(iVar3 >> 0x38),(char)(iVar3 >> 0x30),(char)(iVar3 >> 0x28),
                         mask,in_stack_ffffffffffffff88);
      *(char *)(in_RCX + local_58) = cVar2;
    }
  }
  else {
    for (local_38 = 0; local_38 < in_R8; local_38 = local_38 + 1) {
      SelectionVector::get_index(in_R9,local_38);
      SelectionVector::get_index((SelectionVector *)cidx_1,local_38);
      SelectionVector::get_index((SelectionVector *)bidx_1,local_38);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90);
      if (((bVar1) &&
          (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90), bVar1))
         && (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90), bVar1))
      {
        cVar2 = TernaryLambdaWrapper::
                Operation<signed_char(*)(signed_char,signed_char,signed_char),signed_char,signed_char,signed_char,signed_char>
                          (in_stack_ffffffffffffffa0,
                           (char)((ulong)in_stack_ffffffffffffff98 >> 0x38),
                           (char)((ulong)in_stack_ffffffffffffff98 >> 0x30),
                           (char)((ulong)in_stack_ffffffffffffff98 >> 0x28),
                           (ValidityMask *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        *(char *)(in_RCX + local_38) = cVar2;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}